

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# personal_settings.cpp
# Opt level: O1

void __thiscall PersonalSettings::parse_json(PersonalSettings *this,Json *json)

{
  pointer pcVar1;
  undefined1 *puVar2;
  value_t vVar3;
  byte bVar4;
  undefined1 uVar5;
  bool bVar6;
  Color CVar7;
  const_reference pvVar8;
  const_iterator cVar9;
  byte *pbVar10;
  _Base_ptr p_Var11;
  LandstalkerException *pLVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined1 *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined1 *puVar16;
  _Rb_tree_header *p_Var17;
  ulong uVar18;
  pair<std::_Rb_tree_iterator<unsigned_char>,_std::_Rb_tree_iterator<unsigned_char>_> pVar19;
  initializer_list<unsigned_char> __l;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> mandatory_items;
  bool ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  undefined1 local_b8 [40];
  size_t local_90;
  key_type local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[14],_0>(json,(char (*) [14])"inGameTracker");
  if (bVar6) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"inGameTracker","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)local_b8);
    local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffffffffff00;
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (pvVar8,(boolean_t *)&local_88);
    this->_add_ingame_item_tracker = (bool)(byte)local_88._M_dataplus._M_p;
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
  }
  bVar6 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[9],_0>(json,(char (*) [9])"hudColor");
  if (bVar6) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"hudColor","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)local_b8);
    CVar7 = Color::from_json(pvVar8);
    this->_hud_color = CVar7;
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
  }
  bVar6 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[11],_0>(json,(char (*) [11])"nigelColor");
  if (bVar6) {
    pcVar1 = local_b8 + 0x10;
    local_b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"nigelColor","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)local_b8);
    vVar3 = pvVar8->m_type;
    if ((pointer)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
    if (vVar3 == array) {
      local_b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"nigelColor","");
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)local_b8);
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](pvVar8,0);
      CVar7 = Color::from_json(pvVar8);
      (this->_nigel_colors).first = CVar7;
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      local_b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"nigelColor","");
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)local_b8);
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](pvVar8,1);
      CVar7 = Color::from_json(pvVar8);
      (this->_nigel_colors).second = CVar7;
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
    }
    else {
      local_b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"nigelColor","");
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,(key_type *)local_b8);
      CVar7 = Color::from_json(pvVar8);
      (this->_nigel_colors).first = CVar7;
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      CVar7 = Color::subtract(&(this->_nigel_colors).first,'@');
      (this->_nigel_colors).second = CVar7;
    }
  }
  bVar6 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[12],_0>(json,(char (*) [12])"removeMusic");
  if (bVar6) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"removeMusic","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)local_b8);
    local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffffffffff00;
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (pvVar8,(boolean_t *)&local_88);
    this->_remove_music = (bool)(byte)local_88._M_dataplus._M_p;
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
  }
  bVar6 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[19],_0>(json,(char (*) [19])"swapOverworldMusic");
  if (bVar6) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"swapOverworldMusic","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)local_b8);
    local_88._M_dataplus._M_p = local_88._M_dataplus._M_p & 0xffffffffffffff00;
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (pvVar8,(boolean_t *)&local_88);
    this->_swap_overworld_music = (bool)(byte)local_88._M_dataplus._M_p;
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
  }
  bVar6 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[15],_0>(json,(char (*) [15])"inventoryOrder");
  if (bVar6) {
    (this->_inventory_order)._M_elems[0x10] = 0xff;
    (this->_inventory_order)._M_elems[0x11] = 0xff;
    (this->_inventory_order)._M_elems[0x12] = 0xff;
    (this->_inventory_order)._M_elems[0x13] = 0xff;
    (this->_inventory_order)._M_elems[0x14] = 0xff;
    (this->_inventory_order)._M_elems[0x15] = 0xff;
    (this->_inventory_order)._M_elems[0x16] = 0xff;
    (this->_inventory_order)._M_elems[0x17] = 0xff;
    (this->_inventory_order)._M_elems[0x18] = 0xff;
    (this->_inventory_order)._M_elems[0x19] = 0xff;
    (this->_inventory_order)._M_elems[0x1a] = 0xff;
    (this->_inventory_order)._M_elems[0x1b] = 0xff;
    (this->_inventory_order)._M_elems[0x1c] = 0xff;
    (this->_inventory_order)._M_elems[0x1d] = 0xff;
    (this->_inventory_order)._M_elems[0x1e] = 0xff;
    (this->_inventory_order)._M_elems[0x1f] = 0xff;
    (this->_inventory_order)._M_elems[0] = 0xff;
    (this->_inventory_order)._M_elems[1] = 0xff;
    (this->_inventory_order)._M_elems[2] = 0xff;
    (this->_inventory_order)._M_elems[3] = 0xff;
    (this->_inventory_order)._M_elems[4] = 0xff;
    (this->_inventory_order)._M_elems[5] = 0xff;
    (this->_inventory_order)._M_elems[6] = 0xff;
    (this->_inventory_order)._M_elems[7] = 0xff;
    (this->_inventory_order)._M_elems[8] = 0xff;
    (this->_inventory_order)._M_elems[9] = 0xff;
    (this->_inventory_order)._M_elems[10] = 0xff;
    (this->_inventory_order)._M_elems[0xb] = 0xff;
    (this->_inventory_order)._M_elems[0xc] = 0xff;
    (this->_inventory_order)._M_elems[0xd] = 0xff;
    (this->_inventory_order)._M_elems[0xe] = 0xff;
    (this->_inventory_order)._M_elems[0xf] = 0xff;
    (this->_inventory_order)._M_elems[0x20] = 0xff;
    (this->_inventory_order)._M_elems[0x21] = 0xff;
    (this->_inventory_order)._M_elems[0x22] = 0xff;
    (this->_inventory_order)._M_elems[0x23] = 0xff;
    (this->_inventory_order)._M_elems[0x24] = 0xff;
    (this->_inventory_order)._M_elems[0x25] = 0xff;
    (this->_inventory_order)._M_elems[0x26] = 0xff;
    (this->_inventory_order)._M_elems[0x27] = 0xff;
    local_88._M_dataplus._M_p._0_6_ = 0x202b2f1b3132;
    __l._M_len = 6;
    __l._M_array = (iterator)&local_88;
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set
              ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
               local_b8,__l,(less<unsigned_char> *)&local_50,(allocator_type *)&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"inventoryOrder","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_88);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&local_68,pvVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar2 = local_b8 + 8;
      uVar18 = 0;
      do {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                        *)this,local_68.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar18);
        if ((_Rb_tree_header *)cVar9._M_node ==
            &(this->_item_names)._M_t._M_impl.super__Rb_tree_header) {
          pLVar12 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_50,"Unknown item name \'",
                         local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar18);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_50,"\' in inventory order section of personal settings file.");
          local_88._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar15 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == paVar15) {
            local_88.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          }
          else {
            local_88.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          }
          local_88._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          LandstalkerException::LandstalkerException(pLVar12,&local_88);
          __cxa_throw(pLVar12,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        pbVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                  ::operator[](&this->_item_names,
                               local_68.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar18);
        bVar4 = *pbVar10;
        local_88._M_dataplus._M_p._0_1_ = bVar4;
        (this->_inventory_order)._M_elems[uVar18] = bVar4;
        puVar14 = puVar2;
        for (puVar16 = (undefined1 *)local_b8._16_8_; puVar16 != (undefined1 *)0x0;
            puVar16 = *(undefined1 **)(puVar16 + (ulong)((byte)puVar16[0x20] < bVar4) * 8 + 0x10)) {
          if ((byte)puVar16[0x20] >= bVar4) {
            puVar14 = puVar16;
          }
        }
        puVar16 = puVar2;
        if ((puVar14 != puVar2) && (puVar16 = puVar14, bVar4 < (byte)puVar14[0x20])) {
          puVar16 = puVar2;
        }
        if (puVar16 != puVar2) {
          pVar19 = std::
                   _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                   ::equal_range((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                                  *)local_b8,(key_type_conflict *)&local_88);
          std::
          _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
          ::_M_erase_aux((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                          *)local_b8,(_Base_ptr)pVar19.first._M_node,
                         (_Base_ptr)pVar19.second._M_node);
        }
      } while ((uVar18 < 0x27) &&
              (uVar18 = uVar18 + 1,
              uVar18 < (ulong)((long)local_68.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_68.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5)));
    }
    if (local_90 != 0) {
      p_Var11 = (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var17 = &(this->_item_names)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var17) {
        uVar5 = *(char *)(local_b8._24_8_ + 0x20);
        do {
          if ((char)p_Var11[2]._M_color == uVar5) {
            pLVar12 = (LandstalkerException *)__cxa_allocate_exception(0x28);
            std::operator+(&local_50,"Cannot omit ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var11 + 1));
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_50,
                                 " from inventory order since it could make seeds uncompletable");
            local_88._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
            paVar15 = &pbVar13->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p == paVar15) {
              local_88.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            }
            else {
              local_88.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            }
            local_88._M_string_length = pbVar13->_M_string_length;
            (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
            pbVar13->_M_string_length = 0;
            (pbVar13->field_2)._M_local_buf[0] = '\0';
            LandstalkerException::LandstalkerException(pLVar12,&local_88);
            __cxa_throw(pLVar12,&LandstalkerException::typeinfo,
                        LandstalkerException::~LandstalkerException);
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var17);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::
    _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
    ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)local_b8);
  }
  return;
}

Assistant:

void PersonalSettings::parse_json(const Json& json)
{
    if(json.contains("inGameTracker"))
        _add_ingame_item_tracker = json.at("inGameTracker");

    if(json.contains("hudColor"))
        _hud_color = Color::from_json(json.at("hudColor"));

    if(json.contains("nigelColor"))
    {
        if(json.at("nigelColor").is_array())
        {
            _nigel_colors.first = Color::from_json(json.at("nigelColor")[0]);
            _nigel_colors.second = Color::from_json(json.at("nigelColor")[1]);
        }
        else
        {
            _nigel_colors.first = Color::from_json(json.at("nigelColor"));
            _nigel_colors.second = _nigel_colors.first.subtract(0x40);
        }
    }

    if(json.contains("removeMusic"))
        _remove_music = json.at("removeMusic");

    if(json.contains("swapOverworldMusic"))
        _swap_overworld_music = json.at("swapOverworldMusic");

    if(json.contains("inventoryOrder"))
    {
        _inventory_order.fill(0xFF);

        std::set<uint8_t> mandatory_items = {
            ITEM_KEY, ITEM_IDOL_STONE, ITEM_GARLIC, ITEM_LOGS, ITEM_GOLA_EYE, ITEM_EINSTEIN_WHISTLE
        };

        std::vector<std::string> items = json.at("inventoryOrder");
        for(uint8_t i=0 ; i < items.size() && i < _inventory_order.size() ; ++i)
        {
            if(!_item_names.count(items[i]))
                throw LandstalkerException("Unknown item name '" + items[i] + "' in inventory order section of personal settings file.");
            uint8_t item_id = _item_names[items[i]];
            _inventory_order[i] = item_id;

            if(mandatory_items.contains(item_id))
                mandatory_items.erase(item_id);
        }

        if(!mandatory_items.empty())
        {
            uint8_t first_missing_item_id = *mandatory_items.begin();
            for(auto& [item_name, item_id] : _item_names)
                if(item_id == first_missing_item_id)
                    throw LandstalkerException("Cannot omit " + item_name + " from inventory order since it could make seeds uncompletable");
        }
    }
}